

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O2

Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* shaderPreprocessor_abi_cxx11_
            (Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Source *flat)

{
  Type TVar1;
  pointer pCVar2;
  _Base_ptr p_Var3;
  pointer pCVar4;
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pEVar5;
  string source;
  allocator<char> local_a1;
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  Source *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (flat->version_ != 0) {
    format_abi_cxx11_(&local_90,"#version %d\n");
    std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_a0 = __return_storage_ptr__;
  local_98 = flat;
  for (p_Var3 = (flat->uniforms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(flat->uniforms_)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    if (p_Var3[2]._M_color - _S_black < 4) {
      std::__cxx11::string::append((char *)&local_70);
    }
    std::operator+(&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var3 + 1)
                   ,";");
    std::__cxx11::string::append((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  pCVar4 = (local_98->chunks_).
           super__Vector_base<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>._M_impl
           .super__Vector_impl_data._M_start;
  pCVar2 = (local_98->chunks_).
           super__Vector_base<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>._M_impl
           .super__Vector_impl_data._M_finish;
  do {
    pEVar5 = local_a0;
    if (pCVar4 == pCVar2) {
      Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(local_a0,&local_70);
LAB_00134efb:
      std::__cxx11::string::~string((string *)&local_70);
      return pEVar5;
    }
    TVar1 = pCVar4->type;
    if ((TVar1 == String) || (TVar1 == Uniform)) {
      std::__cxx11::string::append((string *)&local_70);
    }
    else if (TVar1 == Include) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,"Include chunk is invalid in flat shader source",&local_a1);
      pEVar5 = local_a0;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      if (local_50 == &local_40) {
        local_90.field_2._8_8_ = local_40._8_8_;
      }
      else {
        local_90._M_dataplus._M_p = (pointer)local_50;
      }
      local_90._M_string_length = local_48;
      local_48 = 0;
      local_40._M_local_buf[0] = '\0';
      local_50 = &local_40;
      Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(local_a0,(UnexpectedType *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      goto LAB_00134efb;
    }
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

static Expected<std::string, std::string> shaderPreprocessor(const shader::Source &flat) {
	std::string source;
	if (flat.version() != 0)
		source = format("#version %d\n", flat.version());
	for (const auto &[name, decl]: flat.uniforms()) {
		switch(decl.type) {
			case shader::UniformType::Float:
				source += "uniform float ";
				break;
			case shader::UniformType::Vec2:
				source += "uniform vec2 ";
				break;
			case shader::UniformType::Vec3:
				source += "uniform vec3 ";
				break;
			case shader::UniformType::Vec4:
				source += "uniform vec4 ";
				break;
		}
		source += name + ";";
	}

	for (const auto &chunk: flat.chunks()) {
		switch (chunk.type) {
			case shader::Source::Chunk::Type::Uniform:
			case shader::Source::Chunk::Type::String:
				source += chunk.value;
				break;
			case shader::Source::Chunk::Type::Include:
				return Unexpected<std::string>("Include chunk is invalid in flat shader source");
		}
	}

	return Expected<std::string, std::string>(std::move(source));
}